

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMoveToCcr<(moira::Instr)75,(moira::Mode)2,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 data;
  u32 ea;
  
  bVar1 = readOp<(moira::Mode)2,(moira::Size)2,0ul>(this,opcode & 7,&ea,&data);
  if (bVar1) {
    (*this->_vptr_Moira[0x19])(this,4);
    setCCR(this,(u8)data);
    readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,(this->reg).pc + 2);
    prefetch<4ul>(this);
  }
  return;
}

Assistant:

void
Moira::execMoveToCcr(u16 opcode)
{
    int src = _____________xxx(opcode);
    u32 ea, data;
    
    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;

    sync(4);
    setCCR(data);

    (void)readM <MEM_PROG, Word> (reg.pc + 2);
    prefetch<POLLIPL>();
}